

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O0

string * fs_stem_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  path local_98;
  path local_70;
  path local_48;
  undefined1 local_20 [8];
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  local_20 = (undefined1  [8])path._M_len;
  path_local._M_str = (char *)__return_storage_ptr__;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_98,(basic_string_view<char,_std::char_traits<char>_> *)local_20,auto_format);
  std::filesystem::__cxx11::path::filename(&local_70,&local_98);
  std::filesystem::__cxx11::path::stem(&local_48,&local_70);
  std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_stem(std::string_view path)
{
#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).filename().stem().generic_string();
#else
  std::string r = fs_file_name(path);
  // handle special case a/..
  if (r == "..")
    return r;

  // find last dot
  std::string::size_type i = r.find_last_of('.');

  return (i != std::string::npos && i != 0)
    ? r.substr(0, i)
    : r;
#endif
}